

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmCommonTargetGenerator::GetCompilerLauncher
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this,string *lang,string *config)

{
  bool bVar1;
  string *psVar2;
  cmLocalGenerator *lg;
  ulong uVar3;
  string local_a8;
  undefined1 local_88 [8];
  string evaluatedClauncher;
  cmValue clauncher;
  string clauncher_prop;
  string *config_local;
  string *lang_local;
  cmCommonTargetGenerator *this_local;
  string *compilerLauncher;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = std::operator==(lang,"C");
  if (((((bVar1) || (bVar1 = std::operator==(lang,"CXX"), bVar1)) ||
       (bVar1 = std::operator==(lang,"Fortran"), bVar1)) ||
      ((bVar1 = std::operator==(lang,"CUDA"), bVar1 || (bVar1 = std::operator==(lang,"HIP"), bVar1))
      )) || ((bVar1 = std::operator==(lang,"ISPC"), bVar1 ||
             ((bVar1 = std::operator==(lang,"OBJC"), bVar1 ||
              (bVar1 = std::operator==(lang,"OBJCXX"), bVar1)))))) {
    cmStrCat<std::__cxx11::string_const&,char_const(&)[19]>
              ((string *)&clauncher,lang,(char (*) [19])0x112eaf9);
    evaluatedClauncher.field_2._8_8_ =
         cmGeneratorTarget::GetProperty(this->GeneratorTarget,(string *)&clauncher);
    psVar2 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&evaluatedClauncher.field_2 + 8));
    std::__cxx11::string::string((string *)&local_a8,(string *)psVar2);
    lg = cmGeneratorTarget::GetLocalGenerator(this->GeneratorTarget);
    cmGeneratorExpression::Evaluate
              ((string *)local_88,&local_a8,lg,config,this->GeneratorTarget,
               (cmGeneratorExpressionDAGChecker *)0x0,this->GeneratorTarget,lang);
    std::__cxx11::string::~string((string *)&local_a8);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_88);
    }
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)&clauncher);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::GetCompilerLauncher(
  std::string const& lang, std::string const& config)
{
  std::string compilerLauncher;
  if (lang == "C" || lang == "CXX" || lang == "Fortran" || lang == "CUDA" ||
      lang == "HIP" || lang == "ISPC" || lang == "OBJC" || lang == "OBJCXX") {
    std::string const clauncher_prop = cmStrCat(lang, "_COMPILER_LAUNCHER");
    cmValue clauncher = this->GeneratorTarget->GetProperty(clauncher_prop);
    std::string const evaluatedClauncher = cmGeneratorExpression::Evaluate(
      *clauncher, this->GeneratorTarget->GetLocalGenerator(), config,
      this->GeneratorTarget, nullptr, this->GeneratorTarget, lang);
    if (!evaluatedClauncher.empty()) {
      compilerLauncher = evaluatedClauncher;
    }
  }
  return compilerLauncher;
}